

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

ResultBuilder * __thiscall
Catch::ExpressionLhs<std::__cxx11::string_const&>::
captureExpression<(Catch::Internal::Operator)0,char[6]>
          (ExpressionLhs<std::__cxx11::string_const&> *this,char (*rhs) [6])

{
  int iVar1;
  ResultBuilder *pRVar2;
  char *value;
  string local_78;
  string local_58;
  string local_38;
  
  pRVar2 = *(ResultBuilder **)this;
  iVar1 = std::__cxx11::string::compare(*(char **)(this + 8));
  pRVar2 = ResultBuilder::setResultType(pRVar2,iVar1 == 0);
  Catch::toString(&local_38,*(string **)(this + 8));
  pRVar2 = ResultBuilder::setLhs(pRVar2,&local_38);
  Catch::toString_abi_cxx11_(&local_58,(Catch *)rhs,value);
  pRVar2 = ResultBuilder::setRhs(pRVar2,&local_58);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"==","");
  pRVar2 = ResultBuilder::setOp(pRVar2,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return pRVar2;
}

Assistant:

ResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_rb
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }